

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

uint64_t bfy_buffer_remove_ntoh_u64(bfy_buffer *buf)

{
  size_t sVar1;
  int *piVar2;
  ulong local_8;
  
  local_8 = 0;
  sVar1 = bfy_buffer_remove_range(buf,0,8,&local_8);
  if (sVar1 == 8) {
    local_8 = local_8 >> 0x38 | (local_8 & 0xff000000000000) >> 0x28 |
              (local_8 & 0xff0000000000) >> 0x18 | (local_8 & 0xff00000000) >> 8 |
              (local_8 & 0xff000000) << 8 | (local_8 & 0xff0000) << 0x18 |
              (local_8 & 0xff00) << 0x28 | local_8 << 0x38;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x2a;
  }
  return local_8;
}

Assistant:

uint64_t
bfy_buffer_remove_ntoh_u64(struct bfy_buffer* buf) {
    uint64_t val = 0;
    size_t const len = bfy_buffer_remove(buf, sizeof(val), &val);
    if (len == sizeof(val)) {
        val = ntoh64(val);
    } else {
        errno = ENOMSG;
    }
    return val;
}